

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_end(nk_context *ctx)

{
  nk_command_buffer *b;
  nk_panel **ppnVar1;
  nk_rect *pnVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  uint uVar10;
  nk_window *pnVar11;
  nk_panel *pnVar12;
  nk_window *pnVar13;
  nk_user_font *font;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var14;
  undefined1 auVar15 [16];
  nk_vec2 nVar16;
  bool bVar17;
  nk_panel *pnVar18;
  int iVar19;
  int iVar20;
  nk_panel *pnVar21;
  long lVar22;
  uint uVar23;
  nk_window *pnVar24;
  nk_panel *pnVar25;
  uint *puVar26;
  nk_panel_type nVar27;
  nk_page_element *pe;
  nk_context *i;
  bool bVar28;
  float fVar29;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect scroll;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect rect_03;
  nk_rect r_00;
  nk_rect b_00;
  nk_flags local_12c;
  undefined1 local_128 [8];
  undefined4 uStack_120;
  undefined4 uStack_11c;
  nk_vec2 local_118;
  undefined8 uStack_110;
  undefined1 local_108 [24];
  nk_style *local_f0;
  nk_flags state;
  float fStack_e4;
  float local_e0;
  float local_dc;
  undefined1 local_d8 [8];
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined1 local_c8 [16];
  nk_rect local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  nk_rect empty_east;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3fca,"void nk_end(struct nk_context *)");
  }
  pnVar11 = ctx->current;
  if (pnVar11 == (nk_window *)0x0) {
    __assert_fail("ctx->current && \"if this triggers you forgot to call `nk_begin`\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3fcb,"void nk_end(struct nk_context *)");
  }
  pnVar12 = pnVar11->layout;
  if ((pnVar12 == (nk_panel *)0x0) ||
     ((nVar27 = pnVar12->type, nVar27 == NK_PANEL_WINDOW && ((pnVar11->flags & 0x2000) != 0))))
  goto LAB_0012c48e;
  b = &pnVar11->buffer;
  uVar23 = pnVar12->flags;
  i = (nk_context *)0x0;
  if ((uVar23 & 0x1400) == 0) {
    i = ctx;
  }
  if ((nVar27 & (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
                NK_PANEL_GROUP)) == NK_PANEL_NONE) {
    r.w = 16384.0;
    r.h = 16384.0;
    r.x = -8192.0;
    r.y = -8192.0;
    nk_push_scissor(b,r);
    nVar27 = pnVar12->type;
    uVar23 = pnVar12->flags;
  }
  local_118 = (ctx->style).window.scrollbar_size;
  uStack_110 = 0;
  local_f0 = &ctx->style;
  nVar16 = nk_panel_get_padding(&ctx->style,nVar27);
  auVar15._8_4_ = extraout_XMM0_Dc;
  auVar15._0_4_ = nVar16.x;
  auVar15._4_4_ = nVar16.y;
  auVar15._12_4_ = extraout_XMM0_Dd;
  fVar29 = (pnVar12->row).height + pnVar12->at_y;
  pnVar12->at_y = fVar29;
  local_108._0_16_ = auVar15;
  if ((uVar23 & 0x8800) == 0x800) {
    fVar30 = (pnVar12->bounds).y;
    if (fVar29 < (pnVar12->bounds).h + fVar30) {
      (pnVar12->bounds).h = fVar29 - fVar30;
    }
    local_108._4_4_ = nVar16.y;
    rect.y = fVar30;
    rect.x = (pnVar11->bounds).x;
    rect.h = (float)local_108._4_4_;
    rect.w = (pnVar11->bounds).w;
    nk_fill_rect(b,rect,0.0,(ctx->style).window.background);
    rect_00.w = pnVar12->border + (float)local_108._0_4_;
    rect_00.y = (pnVar12->bounds).y;
    rect_00.x = (pnVar11->bounds).x;
    rect_00.h = (pnVar12->bounds).h;
    nk_fill_rect(b,rect_00,0.0,(ctx->style).window.background);
    rect_01.x = ((pnVar12->bounds).x + (pnVar12->bounds).w) - pnVar12->border;
    fVar29 = pnVar12->border + (float)local_108._0_4_;
    if ((*pnVar12->offset_y == 0) && ((pnVar12->flags & 0x20) == 0)) {
      fVar29 = fVar29 + local_118.x;
    }
    rect_01.y = (pnVar12->bounds).y;
    rect_01.h = (pnVar12->bounds).h;
    rect_01.w = fVar29;
    nk_fill_rect(b,rect_01,0.0,(ctx->style).window.background);
    uVar23 = pnVar12->flags;
    if ((uVar23 & 0x20) == 0 && *pnVar12->offset_x != 0) {
      rect_02.y = (pnVar12->bounds).y + (pnVar12->bounds).h;
      rect_02.x = (pnVar11->bounds).x;
      rect_02.h = local_118.y;
      rect_02.w = (pnVar11->bounds).w;
      nk_fill_rect(b,rect_02,0.0,(ctx->style).window.background);
      uVar23 = pnVar12->flags;
    }
  }
  if (((uVar23 & 0x8020) == 0) &&
     (pnVar11->scrollbar_hiding_timer <= 4.0 && pnVar11->scrollbar_hiding_timer != 4.0)) {
    if ((pnVar12->type &
        (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
        NK_PANEL_GROUP)) == NK_PANEL_NONE) {
      if (pnVar11 == ctx->active) {
        bVar28 = pnVar12->has_scrolling != 0;
      }
      else {
        bVar28 = false;
      }
      if (i == (nk_context *)0x0) {
LAB_0012bb04:
        uVar23 = 0;
      }
      else {
        uVar23 = 1;
        bVar17 = bVar28;
        if ((i->input).mouse.scroll_delta.y <= 0.0) {
          bVar17 = (bool)(0.0 < (i->input).mouse.scroll_delta.x & bVar28);
        }
        if (bVar17 == false) goto LAB_0012bb04;
      }
      pnVar11->scrolled = uVar23;
    }
    else {
      pnVar25 = pnVar11->layout;
      pnVar18 = pnVar25;
      do {
        pnVar21 = pnVar18;
        pnVar18 = pnVar21->parent;
        pnVar13 = pnVar11;
      } while (pnVar21->parent != (nk_panel *)0x0);
      do {
        pnVar24 = pnVar13;
        pnVar13 = pnVar24->parent;
      } while (pnVar13 != (nk_window *)0x0);
      if ((pnVar24 == ctx->active) && (pnVar12->has_scrolling != 0)) {
        pnVar2 = &pnVar12->bounds;
        uVar3 = pnVar2->x;
        uVar7 = pnVar2->y;
        local_128._4_4_ = uVar7;
        local_128._0_4_ = uVar3;
        uVar4 = (pnVar12->bounds).w;
        uVar8 = (pnVar12->bounds).h;
        local_d8._4_4_ = uVar8;
        local_d8._0_4_ = uVar4;
        _uStack_120 = 0;
        _uStack_d0 = 0;
        iVar19 = nk_input_is_mouse_hovering_rect(&i->input,*pnVar2);
        if (iVar19 != 0) {
          fVar29 = (pnVar21->clip).x;
          if (((((float)local_128._0_4_ + (float)local_d8._0_4_ < fVar29) ||
               (fVar29 + (pnVar21->clip).w < (float)local_128._0_4_)) ||
              (fVar29 = (pnVar21->clip).y, (float)local_d8._4_4_ + (float)local_128._4_4_ < fVar29))
             || (fVar29 + (pnVar21->clip).h < (float)local_128._4_4_)) goto LAB_0012ba02;
          do {
            ppnVar1 = &pnVar25->parent;
            pnVar25->has_scrolling = 0;
            bVar28 = true;
            pnVar25 = *ppnVar1;
          } while (*ppnVar1 != (nk_panel *)0x0);
          goto LAB_0012bb0c;
        }
      }
LAB_0012ba02:
      bVar28 = false;
    }
LAB_0012bb0c:
    _state = _state & 0xffffffff00000000;
    fVar29 = (pnVar12->bounds).y;
    scroll.x = (pnVar12->bounds).x + (pnVar12->bounds).w + (float)local_108._0_4_;
    fVar30 = (pnVar12->bounds).h;
    scroll.y = fVar29;
    scroll.h = fVar30;
    scroll.w = local_118.x;
    fVar29 = nk_do_scrollbarv(&state,b,scroll,(uint)bVar28,(float)*pnVar12->offset_y,
                              (float)(int)(pnVar12->at_y - fVar29),fVar30 * 0.1,fVar30 * 0.01,
                              &(ctx->style).scrollv,&i->input,(ctx->style).font);
    *pnVar12->offset_y = (nk_uint)(long)fVar29;
    if ((i != (nk_context *)0x0) && (bVar28 != false)) {
      (i->input).mouse.scroll_delta.y = 0.0;
    }
    local_12c = 0;
    fVar29 = (pnVar12->bounds).x;
    fVar34 = (pnVar12->bounds).y + (pnVar12->bounds).h;
    fVar30 = pnVar12->max_x;
    fVar32 = (float)(int)(fVar30 - fVar29);
    font = (ctx->style).font;
    local_dc = 1.0;
    if (1.0 <= local_118.y) {
      local_dc = local_118.y;
    }
    fVar35 = local_dc + local_dc;
    fVar31 = (pnVar12->bounds).w;
    local_e0 = fVar35;
    if (fVar35 <= fVar31) {
      local_e0 = fVar31;
    }
    _state = CONCAT44(fVar34,fVar29);
    fVar31 = 0.0;
    if (local_e0 < fVar32) {
      fVar33 = (float)*pnVar12->offset_x;
      fVar31 = fVar30 * 0.05;
      local_c8 = ZEXT416((uint)fVar32);
      local_128._0_4_ = local_e0;
      local_128._4_4_ = 0;
      uStack_120 = 0;
      uStack_11c = 0;
      local_d8._4_4_ = 0;
      uStack_d0 = 0;
      uStack_cc = 0;
      empty_east.y = fVar34;
      empty_east.h = local_dc;
      if ((ctx->style).scrollh.show_buttons != 0) {
        local_78 = ZEXT416((uint)fVar35);
        local_a8 = ZEXT416((uint)fVar34);
        _local_128 = ZEXT416((uint)local_e0);
        _local_d8 = ZEXT416((uint)fVar29);
        fVar32 = fVar31;
        if (fVar30 * 0.005 <= fVar31) {
          fVar32 = fVar30 * 0.005;
        }
        local_98 = ZEXT416((uint)local_dc);
        local_68 = CONCAT44(fVar34,fVar29);
        uStack_60 = 0;
        bounds.y = fVar34;
        bounds.x = fVar29;
        bounds.h = local_dc;
        bounds.w = local_dc;
        local_88 = local_dc;
        fStack_84 = local_dc;
        fStack_80 = local_dc;
        fStack_7c = local_dc;
        iVar19 = nk_do_button_symbol((nk_flags *)&local_b8,b,bounds,(ctx->style).scrollh.dec_symbol,
                                     NK_BUTTON_REPEATER,&(ctx->style).scrollh.dec_button,&i->input,
                                     font);
        fVar29 = 0.0;
        if (iVar19 != 0) {
          fVar29 = fVar32;
        }
        fVar33 = fVar33 - fVar29;
        fVar29 = (float)local_d8._0_4_ + (float)local_128._0_4_;
        local_128._0_4_ = (float)local_128._0_4_ - (float)local_78._0_4_;
        bounds_00.h = fStack_84;
        bounds_00.w = local_88;
        bounds_00.y = (float)local_68._4_4_;
        bounds_00.x = fVar29 - (float)local_98._0_4_;
        iVar19 = nk_do_button_symbol((nk_flags *)&local_b8,b,bounds_00,
                                     (ctx->style).scrollh.inc_symbol,NK_BUTTON_REPEATER,
                                     &(ctx->style).scrollh.inc_button,&i->input,font);
        if (iVar19 != 0) {
          fVar33 = fVar33 + fVar32;
        }
        fVar29 = (float)local_d8._0_4_ + (float)local_98._0_4_;
        _state = CONCAT44(fStack_e4,fVar29);
        fVar32 = (float)local_c8._0_4_;
        empty_east.y = (float)local_a8._0_4_;
        empty_east.h = (float)local_98._0_4_;
      }
      if ((float)local_128._0_4_ <= fVar31) {
        fVar31 = (float)local_128._0_4_;
      }
      if (fVar32 - (float)local_128._0_4_ <= fVar33) {
        fVar33 = fVar32 - (float)local_128._0_4_;
      }
      fVar30 = 0.0;
      if (0.0 <= fVar33) {
        fVar30 = fVar33;
      }
      fVar34 = (ctx->style).scrollh.border;
      nVar16 = (ctx->style).scrollh.padding;
      fVar35 = nVar16.x;
      fVar33 = nVar16.y;
      local_b8.x = (fVar30 / fVar32) * (float)local_128._0_4_ + fVar29 + fVar34 + fVar35;
      local_b8.y = empty_east.y + fVar34 + fVar33;
      local_b8.w = ((float)local_128._0_4_ / fVar32) * (float)local_128._0_4_ -
                   (fVar35 + fVar35 + fVar34 + fVar34);
      local_b8.h = empty_east.h - (fVar33 + fVar33 + fVar34 + fVar34);
      local_d8._0_4_ = fVar29;
      empty_east.x = local_b8.w + local_b8.x;
      local_40.w = local_b8.x - fVar29;
      empty_east.w = (fVar29 + (float)local_128._0_4_) - empty_east.x;
      local_e0 = (float)local_128._0_4_;
      local_40.x = fVar29;
      local_40.y = empty_east.y;
      local_40.h = empty_east.h;
      fVar31 = nk_scrollbar_behavior
                         (&local_12c,&i->input,(uint)bVar28,(nk_rect *)&state,&local_b8,&local_40,
                          &empty_east,fVar30,fVar32,fVar31,NK_HORIZONTAL);
      local_b8.x = (fVar31 / (float)local_c8._0_4_) * (float)local_128._0_4_ + (float)local_d8._0_4_
      ;
      p_Var14 = (ctx->style).scrollh.draw_begin;
      if (p_Var14 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var14)(b,(nk_handle)(ctx->style).scrollh.userdata.ptr);
      }
      nk_draw_scrollbar(b,local_12c,&(ctx->style).scrollh,(nk_rect *)&state,&local_b8);
      p_Var14 = (ctx->style).scrollh.draw_end;
      if (p_Var14 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var14)(b,(nk_handle)(ctx->style).scrollh.userdata.ptr);
      }
    }
    *pnVar12->offset_x = (nk_uint)(long)fVar31;
  }
  if ((pnVar11->flags & 0x80) == 0) {
LAB_0012bfa3:
    pnVar11->scrollbar_hiding_timer = 0.0;
  }
  else {
    fVar29 = (ctx->input).mouse.delta.x;
    if (((fVar29 != 0.0) || (NAN(fVar29))) ||
       ((fVar29 = (ctx->input).mouse.delta.y, fVar29 != 0.0 || (NAN(fVar29))))) {
      bVar28 = false;
    }
    else {
      bVar28 = (ctx->input).mouse.scroll_delta.y == 0.0;
    }
    iVar19 = nk_window_is_hovered(ctx);
    if ((!(bool)(bVar28 & iVar19 != 0)) && (iVar19 != 0 || (ctx->last_widget_state & 2) != 0))
    goto LAB_0012bfa3;
    pnVar11->scrollbar_hiding_timer = ctx->delta_time_seconds + pnVar11->scrollbar_hiding_timer;
  }
  uVar23 = pnVar12->flags;
  if ((uVar23 & 1) != 0) {
    nVar27 = pnVar12->type;
    if (nVar27 == NK_PANEL_TOOLTIP) {
LAB_0012c04a:
      lVar22 = 0x1cd4;
    }
    else if (nVar27 == NK_PANEL_POPUP) {
      lVar22 = 0x1cc8;
    }
    else if (nVar27 == NK_PANEL_CONTEXTUAL) {
      lVar22 = 0x1cd0;
    }
    else if (nVar27 == NK_PANEL_COMBO) {
      lVar22 = 0x1ccc;
    }
    else {
      if (nVar27 == NK_PANEL_MENU) goto LAB_0012c04a;
      lVar22 = 0x1cc4;
      if (nVar27 == NK_PANEL_GROUP) {
        lVar22 = 0x1cd8;
      }
    }
    if ((short)uVar23 < 0) {
      fVar29 = (ctx->style).window.border + (pnVar11->bounds).y + pnVar12->header_height;
    }
    else if ((uVar23 >> 0xb & 1) == 0) {
      fVar29 = (pnVar11->bounds).y + (pnVar11->bounds).h;
    }
    else {
      fVar29 = (pnVar12->bounds).y + (pnVar12->bounds).h + pnVar12->footer_height;
    }
    uVar5 = (pnVar11->bounds).x;
    uVar9 = (pnVar11->bounds).y;
    rect_03.y = (float)uVar9;
    rect_03.x = (float)uVar5;
    uVar6 = (pnVar11->bounds).w;
    rect_03.h = fVar29 - (float)uVar9;
    rect_03.w = (float)uVar6;
    nk_stroke_rect(b,rect_03,0.0,pnVar12->border,
                   *(nk_color *)((long)local_f0->cursors + lVar22 + -8));
    uVar23 = pnVar12->flags;
  }
  if ((i != (nk_context *)0x0) && ((uVar23 & 0x8004) == 4)) {
    fVar29 = (pnVar12->bounds).x;
    fVar30 = (pnVar12->bounds).y + (pnVar12->bounds).h;
    if ((uVar23 >> 9 & 1) == 0) {
      local_108._0_4_ = fVar29 + (pnVar12->bounds).w + (float)local_108._0_4_;
    }
    else {
      local_108._0_4_ = fVar29 + (float)local_108._0_4_ * -0.5;
    }
    if ((uVar23 & 0x20) != 0) {
      local_108._0_4_ = (float)local_108._0_4_ - local_118.x;
    }
    local_108._4_4_ = fVar30;
    local_108._8_8_ = 0;
    if ((ctx->style).window.scaler.type == NK_STYLE_ITEM_IMAGE) {
      r_00.y = fVar30;
      r_00.x = (float)local_108._0_4_;
      r_00.w = local_118.x;
      r_00.h = local_118.y;
      nk_draw_image(b,r_00,&(ctx->style).window.scaler.data.image,(nk_color)0xffffffff);
    }
    else {
      fVar32 = local_118.x + (float)local_108._0_4_;
      fVar29 = (float)local_108._0_4_;
      if ((uVar23 >> 9 & 1) == 0) {
        fVar29 = fVar32;
        fVar32 = (float)local_108._0_4_;
      }
      nk_fill_triangle(b,fVar29,fVar30,fVar29,local_118.y + fVar30,fVar32,local_118.y + fVar30,
                       (ctx->style).window.scaler.data.color);
    }
    auVar15 = local_108._0_16_;
    if ((pnVar11->flags & 0x1000) == 0) {
      local_f0 = (nk_style *)CONCAT44(local_f0._4_4_,(ctx->style).window.min_size.x);
      local_128._0_4_ = (ctx->style).window.min_size.y;
      iVar19 = (i->input).mouse.buttons[0].down;
      b_00.w = local_118.x;
      b_00.h = local_118.y;
      b_00.x = (float)local_108._0_4_;
      b_00.y = (float)local_108._4_4_;
      local_108._0_16_ = auVar15;
      iVar20 = nk_input_has_mouse_click_down_in_rect(&i->input,NK_BUTTON_LEFT,b_00,1);
      uVar23 = pnVar12->flags;
      if ((iVar19 != 0) && (iVar20 != 0)) {
        fVar29 = (i->input).mouse.delta.x;
        fVar30 = fVar29;
        if ((uVar23 >> 9 & 1) != 0) {
          fVar30 = -fVar29;
          (pnVar11->bounds).x = (pnVar11->bounds).x + fVar29;
        }
        fVar34 = (pnVar11->bounds).w + fVar30;
        fVar32 = (float)local_108._0_4_;
        if ((local_f0._0_4_ <= fVar34) &&
           ((fVar30 < 0.0 || ((0.0 < fVar30 && ((float)local_108._0_4_ <= (i->input).mouse.pos.x))))
           )) {
          (pnVar11->bounds).w = fVar34;
          fVar32 = fVar29 + (float)local_108._0_4_;
        }
        fVar29 = (float)local_108._4_4_;
        if ((uVar23 >> 0xb & 1) == 0) {
          fVar30 = (i->input).mouse.delta.y;
          fVar34 = (pnVar11->bounds).h + fVar30;
          if (((float)local_128._0_4_ < fVar34) &&
             ((fVar30 < 0.0 ||
              ((0.0 < fVar30 && ((float)local_108._4_4_ <= (i->input).mouse.pos.y)))))) {
            (pnVar11->bounds).h = fVar34;
            fVar29 = fVar30 + (float)local_108._4_4_;
          }
        }
        (ctx->style).cursor_active = (ctx->style).cursors[6];
        nVar16.y = local_118.y * 0.5 + fVar29;
        nVar16.x = local_118.x * 0.5 + fVar32;
        (i->input).mouse.buttons[0].clicked_pos = nVar16;
      }
    }
    else {
      uVar23 = pnVar12->flags;
    }
  }
  if ((pnVar12->type &
      (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
      NK_PANEL_GROUP)) == NK_PANEL_NONE) {
    if ((uVar23 >> 0xd & 1) == 0) {
      (pnVar11->buffer).end = (ctx->memory).allocated;
      if ((pnVar11->popup).buf.active != 0) {
        *(nk_size *)((long)(ctx->memory).memory.ptr + (pnVar11->popup).buf.parent + 8) =
             (pnVar11->popup).buf.end;
      }
    }
    else {
      (pnVar11->buffer).last = 0;
      (pnVar11->buffer).begin = 0;
      (pnVar11->buffer).end = 0;
      (pnVar11->buffer).clip = nk_null_rect;
      uVar23 = pnVar12->flags;
    }
  }
  if ((uVar23 >> 0x10 & 1) != 0) {
    uVar23 = uVar23 & 0xfffeefff;
    pnVar12->flags = uVar23;
  }
  pnVar11->flags = uVar23;
  iVar19 = (pnVar11->property).active;
  if (iVar19 == 0) {
    uVar23 = (pnVar11->property).seq;
LAB_0012c3c6:
    (pnVar11->property).old = uVar23;
    (pnVar11->property).prev = iVar19;
    (pnVar11->property).seq = 0;
  }
  else {
    uVar10 = (pnVar11->property).seq;
    uVar23 = (pnVar11->property).old;
    if ((uVar23 == uVar10) || (uVar23 = uVar10, iVar19 != (pnVar11->property).prev))
    goto LAB_0012c3c6;
    nk_zero(&pnVar11->property,0x68);
  }
  iVar19 = (pnVar11->edit).active;
  if (iVar19 == 0) {
    uVar23 = (pnVar11->edit).seq;
LAB_0012c414:
    (pnVar11->edit).old = uVar23;
    (pnVar11->edit).prev = iVar19;
    (pnVar11->edit).seq = 0;
  }
  else {
    uVar10 = (pnVar11->edit).seq;
    uVar23 = (pnVar11->edit).old;
    if ((uVar23 == uVar10) || (uVar23 = uVar10, iVar19 != (pnVar11->edit).prev)) goto LAB_0012c414;
    nk_zero(&pnVar11->edit,0x2c);
  }
  if ((pnVar11->popup).active_con == 0) {
    uVar23 = (pnVar11->popup).con_count;
LAB_0012c455:
    puVar26 = &(pnVar11->popup).con_count;
    (pnVar11->popup).con_old = uVar23;
  }
  else {
    uVar23 = (pnVar11->popup).con_old;
    if (uVar23 == (pnVar11->popup).con_count) goto LAB_0012c455;
    puVar26 = &(pnVar11->popup).active_con;
    (pnVar11->popup).con_count = 0;
    (pnVar11->popup).con_old = 0;
  }
  *puVar26 = 0;
  (pnVar11->popup).combo_count = 0;
  if ((pnVar12->row).tree_depth != 0) {
    __assert_fail("!layout->row.tree_depth",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3e9c,"void nk_panel_end(struct nk_context *)");
  }
  nk_free_page_element(ctx,(nk_page_element *)ctx->current->layout);
LAB_0012c48e:
  ctx->current = (nk_window *)0x0;
  return;
}

Assistant:

NK_API void
nk_end(struct nk_context *ctx)
{
    struct nk_panel *layout;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current && "if this triggers you forgot to call `nk_begin`");
    if (!ctx || !ctx->current)
        return;

    layout = ctx->current->layout;
    if (!layout || (layout->type == NK_PANEL_WINDOW && (ctx->current->flags & NK_WINDOW_HIDDEN))) {
        ctx->current = 0;
        return;
    }
    nk_panel_end(ctx);
    nk_free_panel(ctx, ctx->current->layout);
    ctx->current = 0;
}